

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O3

bool __thiscall Nibbler::getUnsignedNumber(Nibbler *this,double *result)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = this->_length;
  uVar5 = this->_cursor;
  if (uVar1 <= uVar5) {
    return false;
  }
  pcVar2 = (this->_input)._M_dataplus._M_p;
  if ((int)pcVar2[uVar5] - 0x30U < 10) {
    uVar5 = uVar5 + 1;
    do {
      uVar6 = uVar5;
      uVar7 = uVar1;
      if (uVar1 == uVar6) goto LAB_00108b78;
      uVar5 = uVar6 + 1;
    } while ((int)pcVar2[uVar6] - 0x30U < 10);
    if ((pcVar2[uVar6] == '.') && (uVar6 = uVar5, uVar5 < uVar1)) {
      do {
        uVar6 = uVar5;
        if (9 < (int)pcVar2[uVar5] - 0x30U) goto LAB_00108b13;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar1);
    }
    else {
LAB_00108b13:
      uVar7 = uVar6;
      if ((uVar6 < uVar1) && ((byte)(pcVar2[uVar6] | 0x20U) == 0x65)) {
        uVar5 = uVar6 + 1;
        if ((uVar5 < uVar1) && ((pcVar2[uVar5] == '-' || (pcVar2[uVar5] == '+')))) {
          uVar5 = uVar6 + 2;
        }
        if ((uVar1 <= uVar5) || (9 < (int)pcVar2[uVar5] - 0x30U)) goto LAB_00108b71;
        do {
          uVar7 = uVar1;
          if (uVar1 - 1 == uVar5) break;
          lVar3 = uVar5 + 1;
          uVar5 = uVar5 + 1;
          uVar7 = uVar5;
        } while ((int)pcVar2[lVar3] - 0x30U < 10);
      }
    }
LAB_00108b78:
    std::__cxx11::string::substr((ulong)local_40,(ulong)this);
    fVar8 = strtof((char *)local_40[0],(char **)0x0);
    *result = (double)fVar8;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    this->_cursor = uVar7;
    bVar4 = true;
  }
  else {
LAB_00108b71:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Nibbler::getUnsignedNumber (double& result)
{
  std::string::size_type i = _cursor;

  // digit+
  if (i < _length && isdigit (_input[i]))
  {
    ++i;

    while (i < _length && isdigit (_input[i]))
      ++i;

    // ( . digit+ )?
    if (i < _length && _input[i] == '.')
    {
      ++i;

      while (i < _length && isdigit (_input[i]))
        ++i;
    }

    // ( [eE] [+-]? digit+ )?
    if (i < _length && (_input[i] == 'e' || _input[i] == 'E'))
    {
      ++i;

      if (i < _length && (_input[i] == '+' || _input[i] == '-'))
        ++i;

      if (i < _length && isdigit (_input[i]))
      {
        ++i;

        while (i < _length && isdigit (_input[i]))
          ++i;

        result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
        _cursor = i;
        return true;
      }

      return false;
    }

    result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
    _cursor = i;
    return true;
  }

  return false;
}